

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O1

locale __thiscall
booster::locale::impl_icu::create_convert
          (impl_icu *this,locale *in,cdata *cd,character_facet_type type)

{
  utf8_converter_impl *this_00;
  converter_impl<wchar_t> *this_01;
  converter_impl<char> *this_02;
  
  if (type == 2) {
    this_01 = (converter_impl<wchar_t> *)operator_new(0x110);
    converter_impl<wchar_t>::converter_impl(this_01,cd);
    std::locale::locale<booster::locale::impl_icu::converter_impl<wchar_t>>
              ((locale *)this,in,this_01);
  }
  else if (type == 1) {
    if (cd->utf8 == true) {
      this_00 = (utf8_converter_impl *)operator_new(0x38);
      utf8_converter_impl::utf8_converter_impl(this_00,cd);
      std::locale::locale<booster::locale::impl_icu::utf8_converter_impl>((locale *)this,in,this_00)
      ;
    }
    else {
      this_02 = (converter_impl<char> *)operator_new(0x110);
      converter_impl<char>::converter_impl(this_02,cd);
      std::locale::locale<booster::locale::impl_icu::converter_impl<char>>
                ((locale *)this,in,this_02);
    }
  }
  else {
    std::locale::locale((locale *)this,in);
  }
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_convert(std::locale const &in,cdata const &cd,character_facet_type type)
    {
        switch(type) {
        case char_facet:
            #ifdef WITH_CASE_MAPS
            if(cd.utf8)
                return std::locale(in,new utf8_converter_impl(cd));
            #endif
            return std::locale(in,new converter_impl<char>(cd));
        case wchar_t_facet:
            return std::locale(in,new converter_impl<wchar_t>(cd));
        #ifdef BOOSTER_HAS_CHAR16_T
        case char16_t_facet:
            return std::locale(in,new converter_impl<char16_t>(cd));
        #endif
        #ifdef BOOSTER_HAS_CHAR32_T
        case char32_t_facet:
            return std::locale(in,new converter_impl<char32_t>(cd));
        #endif
        default:
            return in;
        }
    }